

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::testInsertRow(tst_RoleMaskProxyModel *this)

{
  uint uVar1;
  QObject *parent;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined8 *puVar5;
  uint *puVar6;
  ModelTest *this_00;
  uint uVar7;
  int iVar8;
  int i;
  RoleMaskProxyModel proxyModel;
  QModelIndex parentIndex;
  QVariant local_80;
  QModelIndex proxyParent;
  QModelIndex local_48;
  
  iVar4 = qMetaTypeId<QAbstractItemModel*>();
  puVar5 = (undefined8 *)QTest::qData("baseModel",iVar4);
  parent = (QObject *)*puVar5;
  if (parent == (QObject *)0x0) {
    return;
  }
  puVar6 = (uint *)QTest::qData("insertIndex",2);
  uVar1 = *puVar6;
  puVar5 = (undefined8 *)QTest::qData("parentIndex",0x2a);
  parentIndex._0_8_ = *puVar5;
  parentIndex.i = puVar5[1];
  parentIndex.m = (QAbstractItemModel *)puVar5[2];
  RoleMaskProxyModel::RoleMaskProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,parent);
  RoleMaskProxyModel::addMaskedRole((int)&proxyModel);
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  QIdentityProxyModel::mapFromSource(&proxyParent);
  uVar7 = 0;
  do {
    iVar4 = QIdentityProxyModel::rowCount((QModelIndex *)&proxyModel);
    if (iVar4 <= (int)uVar7) {
      bVar2 = (bool)(**(code **)(*(long *)parent + 0xf8))(parent,uVar1,1,&parentIndex);
      cVar3 = QTest::qVerify(bVar2,"baseModel->insertRow(insertIndex, parentIndex)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x2a9);
      if (cVar3 != '\0') {
        uVar7 = 0;
        goto LAB_0011350a;
      }
      break;
    }
    QIdentityProxyModel::index
              ((int)&local_48,(int)(QModelIndex *)&proxyModel,(QModelIndex *)(ulong)uVar7);
    QVariant::QVariant(&local_80,uVar7 + 0xbfdd2);
    bVar2 = (bool)RoleMaskProxyModel::setData
                            ((QModelIndex *)&proxyModel,(QVariant *)&local_48,(int)&local_80);
    cVar3 = QTest::qVerify(bVar2,
                           "proxyModel.setData(proxyModel.index(i, 0, proxyParent), magicNumber + i, Qt::UserRole)"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x2a7);
    QVariant::~QVariant(&local_80);
    uVar7 = uVar7 + 1;
  } while (cVar3 != '\0');
LAB_0011368b:
  RoleMaskProxyModel::~RoleMaskProxyModel(&proxyModel);
  return;
LAB_0011350a:
  iVar4 = QIdentityProxyModel::rowCount((QModelIndex *)&proxyModel);
  if (iVar4 <= (int)uVar7) goto LAB_00113642;
  iVar4 = (int)(QModelIndex *)&proxyModel;
  iVar8 = (int)&local_48;
  if (uVar1 == uVar7) {
    QIdentityProxyModel::index(iVar8,iVar4,(QModelIndex *)(ulong)uVar1);
    QModelIndex::data(&local_80,&local_48,0x100);
    bVar2 = QVariant::isValid(&local_80);
    cVar3 = QTest::qVerify(!bVar2,
                           "!proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x2ac);
  }
  else if ((int)uVar1 < (int)uVar7) {
    QIdentityProxyModel::index(iVar8,iVar4,(QModelIndex *)(ulong)uVar7);
    QModelIndex::data(&local_80,&local_48,0x100);
    iVar4 = QVariant::toInt((bool *)&local_80);
    cVar3 = QTest::qCompare(iVar4,uVar7 + 0xbfdd1,
                            "proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).toInt()",
                            "magicNumber + i - 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x2ae);
  }
  else {
    QIdentityProxyModel::index(iVar8,iVar4,(QModelIndex *)(ulong)uVar7);
    QModelIndex::data(&local_80,&local_48,0x100);
    iVar4 = QVariant::toInt((bool *)&local_80);
    cVar3 = QTest::qCompare(iVar4,uVar7 + 0xbfdd2,
                            "proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).toInt()",
                            "magicNumber + i",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x2b0);
  }
  QVariant::~QVariant(&local_80);
  if (cVar3 == '\0') goto LAB_0011368b;
  uVar7 = uVar7 + 1;
  goto LAB_0011350a;
LAB_00113642:
  bVar2 = (bool)(**(code **)(*(long *)parent + 0x108))(parent,uVar1,1,&parentIndex);
  cVar3 = QTest::qVerify(bVar2,"baseModel->removeRow(insertIndex, parentIndex)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x2b2);
  if (cVar3 != '\0') {
    QObject::deleteLater();
  }
  goto LAB_0011368b;
}

Assistant:

void tst_RoleMaskProxyModel::testInsertRow()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(int, insertIndex);
    QFETCH(QModelIndex, parentIndex);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(baseModel);
    const int magicNumber = 785874;
    const QModelIndex proxyParent = proxyModel.mapFromSource(parentIndex);
    for (int i = 0; i < proxyModel.rowCount(proxyParent); ++i) {
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0, proxyParent), magicNumber + i, Qt::UserRole));
    }
    QVERIFY(baseModel->insertRow(insertIndex, parentIndex));
    for (int i = 0; i < proxyModel.rowCount(proxyParent); ++i) {
        if (i == insertIndex)
            QVERIFY(!proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).isValid());
        else if (i > insertIndex)
            QCOMPARE(proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).toInt(), magicNumber + i - 1);
        else
            QCOMPARE(proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).toInt(), magicNumber + i);
    }
    QVERIFY(baseModel->removeRow(insertIndex, parentIndex));
    baseModel->deleteLater();
}